

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_interface.c
# Opt level: O3

void dlep_if_remove(dlep_if *interface)

{
  avl_tree *paVar1;
  list_entity *plVar2;
  ulong uVar3;
  list_entity *plVar4;
  
  uVar3 = (ulong)(interface->session).log_source;
  if (((&log_global_mask)[uVar3] & 1) != 0) {
    oonf_log(1,uVar3,"src/generic/dlep/dlep_interface.c",0x94,0,0,"remove session %s",
             interface->l2_ifname);
  }
  paVar1 = dlep_extension_get_tree();
  plVar4 = (paVar1->list_head).next;
  while( true ) {
    plVar2 = plVar4->prev;
    paVar1 = dlep_extension_get_tree();
    if (plVar2 == (paVar1->list_head).prev) break;
    if ((interface->session).radio == true) {
      plVar2 = plVar4[-1].next;
    }
    else {
      plVar2 = plVar4[-1].prev;
    }
    if (plVar2 != (list_entity *)0x0) {
      (*(code *)plVar2)(interface);
    }
    plVar4 = plVar4->next;
  }
  paVar1 = &_router_if_tree;
  if (interface->radio != false) {
    paVar1 = &_radio_if_tree;
  }
  avl_remove(paVar1,&interface->_node);
  oonf_packet_remove_managed(&interface->udp,true);
  dlep_session_remove(&interface->session);
  oonf_packet_free_managed_config(&interface->udp_config);
  abuf_free(&interface->udp_out);
  return;
}

Assistant:

void
dlep_if_remove(struct dlep_if *interface) {
  struct dlep_extension *ext;

  OONF_DEBUG(interface->session.log_source, "remove session %s", interface->l2_ifname);

  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (interface->session.radio) {
      if (ext->cb_session_cleanup_radio) {
        ext->cb_session_cleanup_radio(&interface->session);
      }
    }
    else {
      if (ext->cb_session_cleanup_router) {
        ext->cb_session_cleanup_router(&interface->session);
      }
    }
  }

  /* remove from tree */
  avl_remove(dlep_if_get_tree(interface->radio), &interface->_node);

  /* close UDP interface */
  oonf_packet_remove_managed(&interface->udp, true);

  /* kill dlep session */
  dlep_session_remove(&interface->session);

  /* free allocated memory data */
  oonf_packet_free_managed_config(&interface->udp_config);
  abuf_free(&interface->udp_out);
}